

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjLoader.cpp
# Opt level: O2

size_t __thiscall
std::hash<PackedVertexPNTCUV>::operator()(hash<PackedVertexPNTCUV> *this,PackedVertexPNTCUV *v)

{
  size_t sVar1;
  long lVar2;
  size_t hashes [15];
  hash<float> local_97;
  hash<float> local_96;
  hash<float> local_95;
  hash<float> local_94;
  hash<float> local_93;
  hash<float> local_92;
  hash<float> local_91;
  hash<float> local_90;
  hash<float> local_8f;
  hash<float> local_8e;
  hash<float> local_8d;
  hash<float> local_8c;
  hash<float> local_8b;
  hash<float> local_8a;
  hash<float> local_89;
  size_t local_88 [16];
  
  local_88[0] = hash<float>::operator()(&local_89,(v->position).field_0.field_0.x);
  local_88[1] = hash<float>::operator()(&local_8a,(v->position).field_0.field_0.y);
  local_88[2] = hash<float>::operator()(&local_8b,(v->position).field_0.field_0.z);
  local_88[3] = hash<float>::operator()(&local_8c,(v->normal).field_0.field_0.x);
  local_88[4] = hash<float>::operator()(&local_8d,(v->normal).field_0.field_0.y);
  local_88[5] = hash<float>::operator()(&local_8e,(v->normal).field_0.field_0.z);
  local_88[6] = hash<float>::operator()(&local_8f,(v->tangent).field_0.field_0.x);
  local_88[7] = hash<float>::operator()(&local_90,(v->tangent).field_0.field_0.y);
  local_88[8] = hash<float>::operator()(&local_91,(v->tangent).field_0.field_0.z);
  local_88[9] = hash<float>::operator()(&local_92,(v->color).field_0.field_0.x);
  local_88[10] = hash<float>::operator()(&local_93,(v->color).field_0.field_0.y);
  local_88[0xb] = hash<float>::operator()(&local_94,(v->color).field_0.field_0.z);
  local_88[0xc] = hash<float>::operator()(&local_95,(v->color).field_0.field_0.w);
  local_88[0xd] = hash<float>::operator()(&local_96,(v->uv).field_0.field_0.x);
  local_88[0xe] = hash<float>::operator()(&local_97,(v->uv).field_0.field_0.y);
  sVar1 = 0;
  for (lVar2 = 0; lVar2 != 0x78; lVar2 = lVar2 + 8) {
    sVar1 = sVar1 ^ (sVar1 >> 2) + sVar1 * 0x40 + *(long *)((long)local_88 + lVar2) + 0x9e3779b9;
  }
  return sVar1;
}

Assistant:

std::size_t operator()(const PackedVertexPNTCUV & v) const
  {
    std::size_t hashes[] = {std::hash<float>()(v.position.x), std::hash<float>()(v.position.y), std::hash<float>()(v.position.z), std::hash<float>()(v.normal.x),  std::hash<float>()(v.normal.y),
                            std::hash<float>()(v.normal.z),   std::hash<float>()(v.tangent.x),  std::hash<float>()(v.tangent.y),  std::hash<float>()(v.tangent.z), std::hash<float>()(v.color.x),
                            std::hash<float>()(v.color.y),    std::hash<float>()(v.color.z),    std::hash<float>()(v.color.w),    std::hash<float>()(v.uv.x),      std::hash<float>()(v.uv.y)};
    std::size_t seed = 0;
    for (std::size_t h : hashes) {
      // from boost::hash_combine
      seed ^= h + 0x9e3779b9 + (seed << 6) + (seed >> 2);
    }
    return seed;
  }